

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstanceSymbols.cpp
# Opt level: O2

Symbol * __thiscall
anon_unknown.dwarf_10a74c4::InstanceBuilder::create
          (InstanceBuilder *this,HierarchicalInstanceSyntax *syntax)

{
  group_type_pointer pgVar1;
  undefined4 uVar2;
  InstanceNameSyntax *pIVar3;
  HierarchyOverrideNode *pHVar4;
  value_type_pointer ppVar5;
  ulong uVar6;
  ASTContext *this_00;
  DimIterator it;
  int iVar7;
  undefined1 auVar8 [16];
  byte bVar9;
  HierarchyOverrideNode *overrideNode;
  Symbol *pSVar10;
  ulong uVar11;
  HierarchicalInstanceSyntax *pHVar12;
  ulong uVar13;
  long lVar14;
  uint uVar15;
  uchar uVar16;
  uchar uVar17;
  uchar uVar18;
  byte bVar19;
  undefined1 auVar20 [16];
  SourceRange sourceRange;
  ulong local_50;
  
  createImplicitNets(syntax,this->context,this->netType,
                     (bitmask<slang::ast::InstanceFlags>)
                     (underlying_type)*(undefined4 *)&this->flags,&this->implicitNetNames,
                     this->implicitNets);
  (this->path).super_SmallVectorBase<unsigned_int>.len = 0;
  pIVar3 = syntax->decl;
  if (pIVar3 == (InstanceNameSyntax *)0x0) {
    this_00 = this->context;
    sourceRange = slang::syntax::SyntaxNode::sourceRange(&syntax->super_SyntaxNode);
    slang::ast::ASTContext::addDiag(this_00,(DiagCode)0x4e0006,sourceRange);
    pSVar10 = createInstance(this,syntax,(HierarchyOverrideNode *)0x0);
    return pSVar10;
  }
  pHVar4 = this->parentOverrideNode;
  if (pHVar4 == (HierarchyOverrideNode *)0x0) {
    overrideNode = (HierarchyOverrideNode *)0x0;
  }
  else {
    pHVar12 = (HierarchicalInstanceSyntax *)this->overrideSyntax;
    if ((HierarchicalInstanceSyntax *)this->overrideSyntax == (HierarchicalInstanceSyntax *)0x0) {
      pHVar12 = syntax;
    }
    auVar8._8_8_ = 0;
    auVar8._0_8_ = pHVar12;
    uVar11 = SUB168(auVar8 * ZEXT816(0x9e3779b97f4a7c15),8) ^
             SUB168(auVar8 * ZEXT816(0x9e3779b97f4a7c15),0);
    uVar13 = uVar11 >> ((byte)(pHVar4->childNodes).table_.
                              super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>,_slang::hash<slang::ast::OpaqueInstancePath::Entry>,_std::equal_to<slang::ast::OpaqueInstancePath::Entry>,_std::allocator<std::pair<const_slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>_>_>
                              .arrays.groups_size_index & 0x3f);
    uVar2 = (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>
              ::match_word(unsigned_long)::word)[uVar11 & 0xff];
    overrideNode = (HierarchyOverrideNode *)0x0;
    local_50 = 0;
    do {
      pgVar1 = (pHVar4->childNodes).table_.
               super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>,_slang::hash<slang::ast::OpaqueInstancePath::Entry>,_std::equal_to<slang::ast::OpaqueInstancePath::Entry>,_std::allocator<std::pair<const_slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>_>_>
               .arrays.groups_ + uVar13;
      bVar9 = pgVar1->m[0xf].n;
      uVar16 = (uchar)uVar2;
      auVar20[0] = -(pgVar1->m[0].n == uVar16);
      uVar17 = (uchar)((uint)uVar2 >> 8);
      auVar20[1] = -(pgVar1->m[1].n == uVar17);
      uVar18 = (uchar)((uint)uVar2 >> 0x10);
      auVar20[2] = -(pgVar1->m[2].n == uVar18);
      bVar19 = (byte)((uint)uVar2 >> 0x18);
      auVar20[3] = -(pgVar1->m[3].n == bVar19);
      auVar20[4] = -(pgVar1->m[4].n == uVar16);
      auVar20[5] = -(pgVar1->m[5].n == uVar17);
      auVar20[6] = -(pgVar1->m[6].n == uVar18);
      auVar20[7] = -(pgVar1->m[7].n == bVar19);
      auVar20[8] = -(pgVar1->m[8].n == uVar16);
      auVar20[9] = -(pgVar1->m[9].n == uVar17);
      auVar20[10] = -(pgVar1->m[10].n == uVar18);
      auVar20[0xb] = -(pgVar1->m[0xb].n == bVar19);
      auVar20[0xc] = -(pgVar1->m[0xc].n == uVar16);
      auVar20[0xd] = -(pgVar1->m[0xd].n == uVar17);
      auVar20[0xe] = -(pgVar1->m[0xe].n == uVar18);
      auVar20[0xf] = -(bVar9 == bVar19);
      uVar15 = (uint)(ushort)((ushort)(SUB161(auVar20 >> 7,0) & 1) |
                              (ushort)(SUB161(auVar20 >> 0xf,0) & 1) << 1 |
                              (ushort)(SUB161(auVar20 >> 0x17,0) & 1) << 2 |
                              (ushort)(SUB161(auVar20 >> 0x1f,0) & 1) << 3 |
                              (ushort)(SUB161(auVar20 >> 0x27,0) & 1) << 4 |
                              (ushort)(SUB161(auVar20 >> 0x2f,0) & 1) << 5 |
                              (ushort)(SUB161(auVar20 >> 0x37,0) & 1) << 6 |
                              (ushort)(SUB161(auVar20 >> 0x3f,0) & 1) << 7 |
                              (ushort)(SUB161(auVar20 >> 0x47,0) & 1) << 8 |
                              (ushort)(SUB161(auVar20 >> 0x4f,0) & 1) << 9 |
                              (ushort)(SUB161(auVar20 >> 0x57,0) & 1) << 10 |
                              (ushort)(SUB161(auVar20 >> 0x5f,0) & 1) << 0xb |
                              (ushort)(SUB161(auVar20 >> 0x67,0) & 1) << 0xc |
                              (ushort)(SUB161(auVar20 >> 0x6f,0) & 1) << 0xd |
                             (ushort)(SUB161(auVar20 >> 0x77,0) & 1) << 0xe);
      if (uVar15 != 0) {
        ppVar5 = (pHVar4->childNodes).table_.
                 super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>,_slang::hash<slang::ast::OpaqueInstancePath::Entry>,_std::equal_to<slang::ast::OpaqueInstancePath::Entry>,_std::allocator<std::pair<const_slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>_>_>
                 .arrays.elements_;
        do {
          iVar7 = 0;
          if (uVar15 != 0) {
            for (; (uVar15 >> iVar7 & 1) == 0; iVar7 = iVar7 + 1) {
            }
          }
          if (*(HierarchicalInstanceSyntax **)
               ((long)&ppVar5[uVar13 * 0xf].first.value + (ulong)(uint)(iVar7 << 7)) == pHVar12) {
            overrideNode = (HierarchyOverrideNode *)
                           ((long)&ppVar5[uVar13 * 0xf].second.paramOverrides.table_.
                                   super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>_>_>
                                   .arrays.groups_size_index + (ulong)(uint)(iVar7 << 7));
            goto LAB_002fd8bc;
          }
          uVar15 = uVar15 - 1 & uVar15;
        } while (uVar15 != 0);
      }
      if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
             is_not_overflowed(unsigned_long)::shift)[(uint)uVar11 & 7] & bVar9) == 0) break;
      uVar6 = (pHVar4->childNodes).table_.
              super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>,_slang::hash<slang::ast::OpaqueInstancePath::Entry>,_std::equal_to<slang::ast::OpaqueInstancePath::Entry>,_std::allocator<std::pair<const_slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>_>_>
              .arrays.groups_size_mask;
      lVar14 = uVar13 + local_50;
      local_50 = local_50 + 1;
      uVar13 = lVar14 + 1U & uVar6;
    } while (local_50 <= uVar6);
  }
LAB_002fd8bc:
  it._M_current =
       (pIVar3->dimensions).
       super_span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>._M_ptr;
  pSVar10 = recurse(this,syntax,overrideNode,it,
                    (DimIterator)
                    (it._M_current +
                    (pIVar3->dimensions).
                    super_span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>.
                    _M_extent._M_extent_value));
  return pSVar10;
}

Assistant:

Symbol* create(const HierarchicalInstanceSyntax& syntax) {
        createImplicitNets(syntax, context, netType, flags, implicitNetNames, implicitNets);

        path.clear();

        if (!syntax.decl) {
            context.addDiag(diag::InstanceNameRequired, syntax.sourceRange());
            return createInstance(syntax, nullptr);
        }

        const HierarchyOverrideNode* overrideNode = nullptr;
        if (parentOverrideNode) {
            if (auto sit = parentOverrideNode->childNodes.find(overrideSyntax ? *overrideSyntax
                                                                              : syntax);
                sit != parentOverrideNode->childNodes.end()) {
                overrideNode = &sit->second;
            }
        }

        auto dims = syntax.decl->dimensions;
        return recurse(syntax, overrideNode, dims.begin(), dims.end());
    }